

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O2

int yaml_parser_register_anchor(yaml_parser_t *parser,int index,yaml_char_t *anchor)

{
  yaml_alias_data_t **top;
  yaml_mark_t *pyVar1;
  yaml_node_t *pyVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  yaml_alias_data_t *pyVar10;
  yaml_alias_data_t *pyVar11;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  
  if (anchor != (yaml_char_t *)0x0) {
    pyVar2 = (parser->document->nodes).start;
    sVar3 = pyVar2[(long)index + -1].start_mark.column;
    pyVar1 = &pyVar2[(long)index + -1].start_mark;
    sVar5 = pyVar1->index;
    sVar6 = pyVar1->line;
    local_48 = (undefined4)sVar5;
    uStack_44 = (undefined4)(sVar5 >> 0x20);
    uStack_40 = (undefined4)sVar6;
    pyVar10 = (parser->aliases).top;
    top = &(parser->aliases).top;
    for (pyVar11 = (parser->aliases).start; pyVar11 != pyVar10; pyVar11 = pyVar11 + 1) {
      iVar9 = strcmp((char *)pyVar11->anchor,(char *)anchor);
      if (iVar9 == 0) {
        yaml_free(anchor);
        sVar4 = (pyVar11->mark).column;
        sVar7 = (pyVar11->mark).index;
        sVar8 = (pyVar11->mark).line;
        parser->error = YAML_COMPOSER_ERROR;
        parser->context = "found duplicate anchor; first occurrence";
        (parser->context_mark).index = sVar7;
        (parser->context_mark).line = sVar8;
        (parser->context_mark).column = sVar4;
        parser->problem = "second occurrence";
        (parser->problem_mark).index = sVar5;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = sVar3;
        return 0;
      }
    }
    if (pyVar10 == (parser->aliases).end) {
      iVar9 = yaml_stack_extend(&(parser->aliases).start,top,&(parser->aliases).end);
      if (iVar9 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        yaml_free(anchor);
        return 0;
      }
      pyVar10 = *top;
    }
    *top = pyVar10 + 1;
    pyVar10->anchor = anchor;
    pyVar10->index = index;
    *(ulong *)&pyVar10->field_0xc = CONCAT44(local_48,uStack_4c);
    *(ulong *)((long)&(pyVar10->mark).index + 4) = CONCAT44(uStack_40,uStack_44);
    (pyVar10->mark).line = sVar6;
    (pyVar10->mark).column = sVar3;
  }
  return 1;
}

Assistant:

static int
yaml_parser_register_anchor(yaml_parser_t *parser,
        int index, yaml_char_t *anchor)
{
    yaml_alias_data_t data;
    yaml_alias_data_t *alias_data;

    if (!anchor) return 1;

    data.anchor = anchor;
    data.index = index;
    data.mark = parser->document->nodes.start[index-1].start_mark;

    for (alias_data = parser->aliases.start;
            alias_data != parser->aliases.top; alias_data ++) {
        if (strcmp((char *)alias_data->anchor, (char *)anchor) == 0) {
            yaml_free(anchor);
            return yaml_parser_set_composer_error_context(parser,
                    "found duplicate anchor; first occurrence",
                    alias_data->mark, "second occurrence", data.mark);
        }
    }

    if (!PUSH(parser, parser->aliases, data)) {
        yaml_free(anchor);
        return 0;
    }

    return 1;
}